

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O3

ActionMessage * __thiscall
helics::NetworkCommsInterface::generatePortRequest
          (ActionMessage *__return_storage_ptr__,NetworkCommsInterface *this,int cnt)

{
  _Alloc_hider __src;
  string_view string1;
  string_view string2;
  string local_48;
  
  ActionMessage::ActionMessage(__return_storage_ptr__,cmd_protocol);
  __return_storage_ptr__->messageID = 0x5af;
  gmlc::networking::stripProtocol(&local_48,&(this->super_CommsInterface).localTargetAddress);
  __src._M_p = local_48._M_dataplus._M_p;
  if ((byte *)local_48._M_dataplus._M_p == (__return_storage_ptr__->payload).heap) {
    (__return_storage_ptr__->payload).bufferSize = local_48._M_string_length;
  }
  else {
    SmallBuffer::reserve(&__return_storage_ptr__->payload,local_48._M_string_length);
    (__return_storage_ptr__->payload).bufferSize = local_48._M_string_length;
    if (local_48._M_string_length != 0) {
      memcpy((__return_storage_ptr__->payload).heap,__src._M_p,local_48._M_string_length);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  __return_storage_ptr__->counter = (uint16_t)cnt;
  string1._M_str = (this->super_CommsInterface).brokerName._M_dataplus._M_p;
  string1._M_len = (this->super_CommsInterface).brokerName._M_string_length;
  string2._M_str = (this->super_CommsInterface).brokerInitString._M_dataplus._M_p;
  string2._M_len = (this->super_CommsInterface).brokerInitString._M_string_length;
  ActionMessage::setStringData(__return_storage_ptr__,string1,string2);
  return __return_storage_ptr__;
}

Assistant:

ActionMessage NetworkCommsInterface::generatePortRequest(int cnt) const
{
    ActionMessage req(CMD_PROTOCOL);
    req.messageID = REQUEST_PORTS;
    req.payload = gmlc::networking::stripProtocol(localTargetAddress);
    req.counter = cnt;
    req.setStringData(brokerName, brokerInitString);
    return req;
}